

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

string * __thiscall
Catch::StringMaker<wchar_t_const*,void>::convert_abi_cxx11_
          (string *__return_storage_ptr__,StringMaker<wchar_t_const*,void> *this,wchar_t *str)

{
  size_t sVar1;
  long in_FS_OFFSET;
  wstring local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (this == (StringMaker<wchar_t_const*,void> *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,"{null string}","");
      return __return_storage_ptr__;
    }
  }
  else {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    sVar1 = wcslen((wchar_t *)this);
    std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_48,this,this + sVar1 * 4);
    StringMaker<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_void>
    ::convert(__return_storage_ptr__,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

std::string StringMaker<wchar_t const*>::convert(wchar_t const * str) {
    if (str) {
        return ::Catch::Detail::stringify(std::wstring{ str });
    } else {
        return{ "{null string}" };
    }
}